

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_drop_col(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol_00;
  int local_54;
  int rc;
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 1) {
    jx9_context_throw_error(pCtx,1,"Missing collection name");
    jx9_result_bool(pCtx,0);
  }
  else {
    _rc = jx9_value_to_string(*argv,&local_54);
    if (local_54 < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_bool(pCtx,0);
    }
    else {
      sName.zString._0_4_ = local_54;
      sName._8_8_ = jx9_context_user_data(pCtx);
      pCol_00 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)&rc,4);
      if (pCol_00 == (unqlite_col *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&rc);
        jx9_result_bool(pCtx,0);
      }
      else {
        iVar1 = unqliteDropCollection(pCol_00);
        jx9_result_bool(pCtx,(uint)(iVar1 == 0));
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_drop_col(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Drop the collection */
	rc = unqliteDropCollection(pCol);
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}